

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

void __thiscall tcu::Matrix<double,_2,_2>::Matrix(Matrix<double,_2,_2> *this)

{
  long lVar1;
  int row;
  long lVar2;
  long lVar3;
  uint uVar4;
  
  Vector<tcu::Vector<double,_2>,_2>::Vector(&this->m_data);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 0x10) {
      uVar4 = 0x3ff00000;
      if (lVar1 != lVar3) {
        uVar4 = 0;
      }
      *(ulong *)((long)this + lVar3) = (ulong)uVar4 << 0x20;
    }
    this = (Matrix<double,_2,_2> *)((long)this + 8);
    lVar1 = lVar1 + 0x10;
  }
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (void)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = (row == col) ? T(1) : T(0);
}